

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

ArgSlot EmitNewObjectOfConstants
                  (ParseNode *pnode,ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo,
                  uint argCount)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this;
  code *pcVar1;
  bool bVar2;
  ArgSlot AVar3;
  BOOL BVar4;
  RegSlot RVar5;
  undefined4 *puVar6;
  VarArrayVarCount *obj;
  ParseNodeCall *pPVar7;
  VarArrayVarCount *vars;
  ByteCodeGenerator *byteCodeGenerator_00;
  uint argCount_00;
  
  argCount_00 = argCount - 1;
  if (argCount_00 < 0x20000000) {
    this = &byteCodeGenerator->alloc->
            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_0081d415;
      *puVar6 = 0;
    }
    obj = (VarArrayVarCount *)
          Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::AllocInternal
                    (this,(ulong)(argCount_00 * 8) + 8);
    if (obj == (VarArrayVarCount *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x20d,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) {
LAB_0081d415:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
    }
    obj->count = (Var)((ulong)argCount_00 | 0x1000000000000);
    vars = obj + 1;
    byteCodeGenerator_00 = (ByteCodeGenerator *)pnode;
    pPVar7 = ParseNode::AsParseNodeCall(pnode);
    EmitConstantArgsToVarArray(byteCodeGenerator_00,&vars->count,pPVar7->pnodeArgs,argCount_00);
    RVar5 = (RegSlot)vars;
    pPVar7 = ParseNode::AsParseNodeCall(pnode);
    AVar3 = EmitArgListEnd(pPVar7->pnodeArgs,RVar5,0xffffffff,0xffffffff,byteCodeGenerator,funcInfo,
                           (ulong)argCount_00,0xffff);
    pPVar7 = ParseNode::AsParseNodeCall(pnode);
    Js::ByteCodeWriter::RemoveEntryForRegSlotFromCacheIdMap
              (&byteCodeGenerator->m_writer,pPVar7->pnodeTarget->location);
    RVar5 = FuncInfo::AcquireLoc(funcInfo,pnode);
    if (argCount_00 != 0x1fffffff) {
      pPVar7 = ParseNode::AsParseNodeCall(pnode);
      Js::ByteCodeWriter::AuxiliaryContext
                (&byteCodeGenerator->m_writer,NewScObject_A,RVar5,obj,argCount_00 * 8 + 8,
                 pPVar7->pnodeTarget->location);
      Memory::
      DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,Js::VarArrayVarCount>
                (byteCodeGenerator->alloc,obj,(ulong)(argCount_00 * 8));
      return AVar3;
    }
  }
  Math::DefaultOverflowPolicy();
}

Assistant:

Js::ArgSlot EmitNewObjectOfConstants(
    ParseNode *pnode,
    ByteCodeGenerator *byteCodeGenerator,
    FuncInfo *funcInfo,
    unsigned int argCount)
{
    EmitArgListStart(Js::Constants::NoRegister, byteCodeGenerator, funcInfo, Js::Constants::NoProfileId);

    // Create the vars array
    Js::VarArrayVarCount *vars = AnewPlus(byteCodeGenerator->GetAllocator(), UInt32Math::Mul((argCount - 1), sizeof(Js::Var)), Js::VarArrayVarCount, Js::TaggedInt::ToVarUnchecked(argCount - 1));

    // Emit all constants to the vars array
    EmitConstantArgsToVarArray(byteCodeGenerator, vars->elements, pnode->AsParseNodeCall()->pnodeArgs, argCount - 1);

    // Finish the arg list
    Js::ArgSlot actualArgCount = EmitArgListEnd(
        pnode->AsParseNodeCall()->pnodeArgs,
        Js::Constants::NoRegister,
        Js::Constants::NoRegister,
        Js::Constants::NoRegister,
        byteCodeGenerator,
        funcInfo,
        argCount - 1,
        Js::Constants::NoProfileId);

    // Make sure the cacheId to regSlot map in the ByteCodeWriter is left in a consistent state after writing NewScObject_A
    byteCodeGenerator->Writer()->RemoveEntryForRegSlotFromCacheIdMap(pnode->AsParseNodeCall()->pnodeTarget->location);

    // Generate the opcode with vars
    byteCodeGenerator->Writer()->AuxiliaryContext(
        Js::OpCode::NewScObject_A,
        funcInfo->AcquireLoc(pnode),
        vars,
        UInt32Math::MulAdd<sizeof(Js::Var), sizeof(Js::VarArray)>((argCount-1)),
        pnode->AsParseNodeCall()->pnodeTarget->location);


        AdeletePlus(byteCodeGenerator->GetAllocator(), UInt32Math::Mul((argCount-1), sizeof(Js::VarArrayVarCount)), vars);

    return actualArgCount;
}